

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cc
# Opt level: O1

RC __thiscall StatisticsMgr::Reset(StatisticsMgr *this,char *psKey)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  RC RVar5;
  uint uVar6;
  InternalNode *pIVar7;
  InternalNode **ppIVar8;
  uint uVar9;
  uint uVar10;
  
  if (psKey != (char *)0x0) {
    uVar1 = (this->llStats).iLength;
    if ((int)uVar1 < 1) {
      uVar3 = 0;
    }
    else {
      uVar10 = 0;
      uVar6 = (this->llStats).iLastRef;
      do {
        uVar9 = uVar10 + 1;
        if (uVar6 == 0xffffffff) {
          uVar3 = uVar1;
          if ((int)uVar9 < (int)(uVar1 - uVar9)) {
            uVar3 = 1;
          }
          ppIVar8 = &(this->llStats).pnHead + ((int)(uVar1 - uVar9) <= (int)uVar9);
        }
        else {
          uVar3 = uVar9 - uVar6;
          uVar2 = -uVar3;
          if (0 < (int)uVar3) {
            uVar2 = uVar3;
          }
          uVar3 = 1;
          ppIVar8 = &(this->llStats).pnHead;
          if (uVar2 <= uVar9) {
            uVar3 = uVar6;
            if ((int)(uVar1 - uVar9) <= (int)uVar2) {
              uVar3 = uVar1;
            }
            ppIVar8 = &(this->llStats).pnTail + ((int)uVar2 < (int)(uVar1 - uVar9));
          }
        }
        pIVar7 = *ppIVar8;
        for (; uVar3 != uVar9; uVar3 = uVar3 + (-(uint)((int)uVar10 < (int)uVar3) | 1)) {
          pIVar7 = (&pIVar7->next)[(int)uVar10 < (int)uVar3];
        }
        (this->llStats).iLastRef = uVar9;
        (this->llStats).pnLastRef = pIVar7;
        iVar4 = strcmp(psKey,(pIVar7->Data).psKey);
        uVar3 = uVar10;
      } while ((iVar4 != 0) && (uVar10 = uVar10 + 1, uVar6 = uVar9, uVar3 = uVar1, uVar10 != uVar1))
      ;
    }
    RVar5 = 0x232a;
    if (uVar3 != uVar1) {
      LinkList<Statistic>::Delete(&this->llStats,uVar3);
      RVar5 = 0;
    }
    return RVar5;
  }
  return 0x2329;
}

Assistant:

RC StatisticsMgr::Reset(const char *psKey)
{
   int i, iCount;
   Statistic *pStat = NULL;

   if (psKey==NULL)
      return STAT_INVALID_ARGS;

   iCount = llStats.GetLength();

   for (i=0; i < iCount; i++) {
      pStat = llStats[i];
      if (*pStat == psKey)
         break;
   }

   // If we found the statistic then remove it from the list
   if (i!=iCount)
      llStats.Delete(i);
   else
      return STAT_UNKNOWN_KEY;

   return 0;
}